

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

string_view absl::lts_20250127::FindLongestCommonPrefix(string_view a,string_view b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  type_conflict tVar3;
  unsigned_long *puVar4;
  const_pointer __str;
  const_pointer pvVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  uint64_t xor_bytes;
  uint64_t xor_bytes_2;
  size_type sStack_68;
  uint16_t xor_bytes_1;
  size_type count;
  char *pb;
  char *pa;
  size_type local_48;
  unsigned_long local_40;
  size_type limit;
  string_view b_local;
  string_view a_local;
  
  a_local._M_len = (size_t)a._M_str;
  b_local._M_str = (char *)a._M_len;
  b_local._M_len = (size_t)b._M_str;
  limit = b._M_len;
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
  pa = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&limit);
  puVar4 = std::min<unsigned_long>(&local_48,(unsigned_long *)&pa);
  local_40 = *puVar4;
  __str = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&b_local._M_str);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&limit);
  sStack_68 = 0;
  if (local_40 < 8) {
    for (; sStack_68 + 2 <= local_40; sStack_68 = sStack_68 + 2) {
      uVar1 = little_endian::Load16(__str + sStack_68);
      uVar2 = little_endian::Load16(pvVar5 + sStack_68);
      if ((uVar1 ^ uVar2) != 0) {
        if (((uVar1 ^ uVar2) & 0xff) == 0) {
          sStack_68 = sStack_68 + 1;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,
                   sStack_68);
        return stack0xffffffffffffffe8;
      }
    }
    if ((sStack_68 != local_40) && (__str[sStack_68] == pvVar5[sStack_68])) {
      sStack_68 = sStack_68 + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,sStack_68);
  }
  else {
    do {
      uVar6 = little_endian::Load64(__str + sStack_68);
      uVar7 = little_endian::Load64(pvVar5 + sStack_68);
      if ((uVar6 ^ uVar7) != 0) {
        tVar3 = countr_zero<unsigned_long>(uVar6 ^ uVar7);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,
                   (long)(tVar3 >> 3) + sStack_68);
        return stack0xffffffffffffffe8;
      }
      uVar8 = sStack_68 + 0x10;
      sStack_68 = sStack_68 + 8;
    } while (uVar8 < local_40);
    lVar9 = local_40 - 8;
    uVar6 = little_endian::Load64(__str + lVar9);
    uVar7 = little_endian::Load64(pvVar5 + lVar9);
    if ((uVar6 ^ uVar7) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,local_40)
      ;
    }
    else {
      tVar3 = countr_zero<unsigned_long>(uVar6 ^ uVar7);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&a_local._M_str,__str,
                 (tVar3 >> 3) + lVar9);
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

absl::string_view FindLongestCommonPrefix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  const char* const pa = a.data();
  const char* const pb = b.data();
  absl::string_view::size_type count = (unsigned) 0;

  if (ABSL_PREDICT_FALSE(limit < 8)) {
    while (ABSL_PREDICT_TRUE(count + 2 <= limit)) {
      uint16_t xor_bytes = absl::little_endian::Load16(pa + count) ^
                           absl::little_endian::Load16(pb + count);
      if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
        if (ABSL_PREDICT_TRUE((xor_bytes & 0xff) == 0)) ++count;
        return absl::string_view(pa, count);
      }
      count += 2;
    }
    if (ABSL_PREDICT_TRUE(count != limit)) {
      if (ABSL_PREDICT_TRUE(pa[count] == pb[count])) ++count;
    }
    return absl::string_view(pa, count);
  }

  do {
    uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                         absl::little_endian::Load64(pb + count);
    if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
      count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
      return absl::string_view(pa, count);
    }
    count += 8;
  } while (ABSL_PREDICT_TRUE(count + 8 < limit));

  count = limit - 8;
  uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                       absl::little_endian::Load64(pb + count);
  if (ABSL_PREDICT_TRUE(xor_bytes != 0)) {
    count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
    return absl::string_view(pa, count);
  }
  return absl::string_view(pa, limit);
}